

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

int8 * rw::ps2::getADCbitsForMesh(Geometry *geo,Mesh *mesh)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  int8 *piVar4;
  ulong uVar5;
  
  lVar1 = (long)adcOffset;
  if ((lVar1 != 0) && (*(int *)((long)geo->texCoords + lVar1 + -0x38) != 0)) {
    piVar4 = *(int8 **)((long)geo->texCoords + lVar1 + -0x30);
    uVar5 = 0;
    if (piVar4 != (int8 *)0x0) {
      uVar2 = ((long)mesh + (-0x10 - (long)geo->meshHeader)) / 0x18;
      uVar3 = uVar2 & 0xffffffff;
      if ((int)uVar2 < 1) {
        uVar3 = uVar5;
      }
      for (; uVar3 * 0x18 - uVar5 != 0; uVar5 = uVar5 + 0x18) {
        piVar4 = piVar4 + *(uint *)((long)&geo->meshHeader[1].totalIndices + uVar5);
      }
      return piVar4;
    }
  }
  return (int8 *)0x0;
}

Assistant:

int8*
getADCbits(Geometry *geo)
{
	int8 *bits = nil;
	if(adcOffset){
		ADCData *adc = PLUGINOFFSET(ADCData, geo, adcOffset);
		if(adc->adcFormatted)
			bits = adc->adcBits;
	}
	return bits;
}